

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

PathIntegrator *
phyr::createPathIntegrator
          (shared_ptr<phyr::Sampler> *sampler,shared_ptr<const_phyr::Camera> *camera,int maxDepth)

{
  int iVar1;
  PathIntegrator *this;
  allocator local_71;
  __shared_ptr<phyr::Sampler,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  Bounds2i _pixelBounds;
  
  _pixelBounds = Film::getSampleBounds
                           (((camera->
                             super___shared_ptr<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->film);
  iVar1 = Bounds2<int>::area(&_pixelBounds);
  if (iVar1 == 0) {
    formatString<char_const*,int>
              (&local_50,"[%s] \x1b[31;1mERROR(%d):\x1b[0m Degenerate pixel bounds specified\n",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/methusael13[P]phy-ray/phyray_lib/src/modules/integrators/path.cpp"
               ,0x7a);
    std::operator<<((ostream *)&std::cerr,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    this = (PathIntegrator *)0x0;
  }
  else {
    this = (PathIntegrator *)operator_new(0x70);
    std::__shared_ptr<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,&camera->super___shared_ptr<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2>
              );
    std::__shared_ptr<phyr::Sampler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,&sampler->super___shared_ptr<phyr::Sampler,_(__gnu_cxx::_Lock_policy)2>);
    std::__cxx11::string::string((string *)&local_50,"spatial",&local_71);
    PathIntegrator::PathIntegrator
              (this,maxDepth,(shared_ptr<const_phyr::Camera> *)&local_60,
               (shared_ptr<phyr::Sampler> *)&local_70,&_pixelBounds,1.0,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  }
  return this;
}

Assistant:

PathIntegrator* createPathIntegrator(std::shared_ptr<Sampler> sampler,
                                     std::shared_ptr<const Camera> camera,
                                     int maxDepth) {
    Bounds2i _pixelBounds = camera->film->getSampleBounds();

    if (_pixelBounds.area() == 0) {
        LOG_ERR("Degenerate pixel bounds specified");
        return nullptr;
    }

    return new PathIntegrator(maxDepth, camera, sampler, _pixelBounds, 1, "spatial");
}